

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave-in.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  typed_value<unsigned_long,_char> *ptVar2;
  size_type sVar3;
  ostream *poVar4;
  long *plVar5;
  undefined8 extraout_RDX;
  int iVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  complex<double> iq;
  char qq;
  char ii;
  complex<double> local_4c8;
  size_t sample_rate;
  _Any_data local_4a8;
  code *local_498;
  code *local_490;
  undefined1 local_488 [2] [16];
  variables_map vm;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_458 [144];
  options_description desc;
  demod_nrz wavein;
  
  std::__cxx11::string::string((string *)&wavein,"WavingZ - Wave-in options",(allocator *)&vm);
  boost::program_options::options_description::options_description
            (&desc,(string *)&wavein,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string((string *)&wavein);
  wavein.fsk_demod.s1._M_value._0_8_ = boost::program_options::options_description::add_options();
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&wavein,"help,h");
  ptVar2 = boost::program_options::value<unsigned_long>(&sample_rate);
  _vm = 2000000;
  ptVar2 = boost::program_options::typed_value<unsigned_long,_char>::default_value
                     (ptVar2,(unsigned_long *)&vm);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"sample_rate,s",(char *)ptVar2);
  boost::program_options::options_description_easy_init::operator()(pcVar1,"unsigned,u");
  boost::program_options::variables_map::variables_map(&vm);
  local_488[0] = (undefined1  [16])0x0;
  local_488[1] = (undefined1  [16])0x0;
  boost::program_options::parse_command_line<char>
            ((basic_parsed_options<char> *)&wavein,argc,argv,&desc,0,
             (function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)local_488);
  boost::program_options::store((basic_parsed_options *)&wavein,&vm,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)&wavein);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1((function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)local_488);
  boost::program_options::notify(&vm);
  std::__cxx11::string::string((string *)&wavein,"help",(allocator *)&local_4c8);
  sVar3 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_458,(key_type *)&wavein);
  std::__cxx11::string::~string((string *)&wavein);
  if (sVar3 == 0) {
    std::__cxx11::string::string((string *)&wavein,"unsigned",(allocator *)&local_4c8);
    sVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count(local_458,(key_type *)&wavein);
    std::__cxx11::string::~string((string *)&wavein);
    local_4a8 = (_Any_data)0x0;
    local_490 = std::_Function_handler<void_(unsigned_char_*,_unsigned_char_*),_process_wavingz>::
                _M_invoke;
    local_498 = std::_Function_handler<void_(unsigned_char_*,_unsigned_char_*),_process_wavingz>::
                _M_manager;
    wavingz::demod::demod_nrz::demod_nrz
              (&wavein,sample_rate,(function<void_(unsigned_char_*,_unsigned_char_*)> *)&local_4a8);
    std::_Function_base::~_Function_base((_Function_base *)&local_4a8);
    while( true ) {
      local_4c8._M_value = (_ComplexT)0x0;
      plVar5 = (long *)std::istream::get((char *)&std::cin);
      if ((*(byte *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20) & 5) != 0) break;
      pcVar1 = &qq;
      plVar5 = (long *)std::istream::get((char *)&std::cin);
      if ((*(byte *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20) & 5) != 0) break;
      if (sVar3 == 0) {
        auVar9._0_8_ = (double)(int)ii;
        auVar9._8_8_ = (double)(int)((long)((ulong)(byte)qq << 0x38) >> 0x38);
        local_4c8._M_value = (_ComplexT)divpd(auVar9,_DAT_00117010);
      }
      else {
        auVar8._0_8_ = (double)(byte)ii;
        auVar8._8_8_ = (double)(byte)qq;
        auVar9 = divpd(auVar8,_DAT_00117010);
        local_4c8._M_value._0_8_ = auVar9._0_8_ + -1.0;
        local_4c8._M_value._8_8_ = auVar9._8_8_ + -1.0;
      }
      dVar7 = std::abs<double>(&local_4c8);
      if (1.0 < dVar7) {
        __assert_fail("std::abs(iq) <= 1.0",
                      "/workspace/llm4binary/github/license_c_cmakelists/baol[P]waving-z/wave-in.cpp"
                      ,0x5d,"int main(int, char **)");
      }
      iq._M_value._8_8_ = extraout_RDX;
      iq._M_value._0_8_ = pcVar1;
      wavingz::demod::demod_nrz::operator()(&wavein,iq);
    }
    wavingz::demod::demod_nrz::~demod_nrz(&wavein);
    iVar6 = 0;
  }
  else {
    poVar4 = (ostream *)boost::program_options::operator<<((ostream *)&std::cout,&desc);
    std::operator<<(poVar4,"\n");
    std::operator<<((ostream *)&std::cout,"\n");
    poVar4 = std::operator<<((ostream *)&std::cout,"Examples:");
    std::operator<<(poVar4,"\n");
    std::operator<<((ostream *)&std::cout,"\n");
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "   rtl_sdr -f 868420000 -s 2000000 -g 15 - | ./wave-in -s 2000000 -u")
    ;
    std::operator<<(poVar4,"\n");
    std::operator<<((ostream *)&std::cout,"\n");
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "   hackrf_transfer -f 868420000 -s 2000000 -r data.cs8");
    std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<((ostream *)&std::cout,"   ./wave-in -s 2000000 -u < data.cs8");
    std::operator<<(poVar4,"\n");
    std::operator<<((ostream *)&std::cout,"\n");
    iVar6 = 1;
  }
  boost::program_options::variables_map::~variables_map(&vm);
  boost::program_options::options_description::~options_description(&desc);
  return iVar6;
}

Assistant:

int
main(int argc, char** argv)
{
    size_t sample_rate;

    po::options_description desc("WavingZ - Wave-in options");
    desc.add_options()
        ("help,h", "Produce this help message")
        ("sample_rate,s", po::value<size_t>(&sample_rate)->default_value(2000000), "Sample rate (default 2M)")
        ("unsigned,u", "Use unsigned8 (RTL-SDR) instead of signed8 (HackRF One)")
       ;

    po::variables_map vm;
    po::store(po::parse_command_line(argc, argv, desc), vm);
    po::notify(vm);

    if (vm.count("help")) {
        cout << desc << "\n";
        cout << "\n";
        cout << "Examples:" << "\n";
        cout << "\n";
        cout << "   rtl_sdr -f 868420000 -s 2000000 -g 15 - | ./wave-in -s 2000000 -u" << "\n";
        cout << "\n";
        cout << "   hackrf_transfer -f 868420000 -s 2000000 -r data.cs8" << "\n";
        cout << "   ./wave-in -s 2000000 -u < data.cs8" << "\n";
        cout << "\n";
        return 1;
    }

    bool unsigned_input = vm.count("unsigned");

    struct process_wavingz {
        void operator()(uint8_t* begin, uint8_t*end)
        {
            wavingz::zwave_print(std::cout, begin, end) << std::endl;
        }
    } wave_callback;

    wavingz::demod::demod_nrz wavein(sample_rate, wave_callback);

    for(;;) {
        std::complex<double> iq;
        char ii, qq;
        if(!cin.get(ii) || !cin.get(qq)) break;
        if (unsigned_input)
        {
            iq.real(double((uint8_t)ii)/127.0 - 1.0);
            iq.imag(double((uint8_t)qq) / 127.0 - 1.0);
        }
        else
        {
            iq.real(double(ii)/127.0);
            iq.imag(double(qq)/127.0);
        }
        assert(std::abs(iq) <= 1.0);
        wavein(iq);
    }
    return 0;
}